

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sumInverse(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  SumCtx *pSVar2;
  double dVar3;
  i64 iVal;
  int type;
  SumCtx *p;
  sqlite3_context *in_stack_ffffffffffffffb8;
  sqlite3_value *in_stack_ffffffffffffffc0;
  i64 in_stack_ffffffffffffffc8;
  
  pSVar2 = (SumCtx *)sqlite3_aggregate_context(in_stack_ffffffffffffffb8,0);
  iVar1 = sqlite3_value_numeric_type(in_stack_ffffffffffffffc0);
  if ((pSVar2 != (SumCtx *)0x0) && (iVar1 != 5)) {
    pSVar2->cnt = pSVar2->cnt + -1;
    if (pSVar2->approx == '\0') {
      sqlite3_value_int64((sqlite3_value *)0x2259b0);
      iVar1 = sqlite3SubInt64((i64 *)in_stack_ffffffffffffffb8,0x2259bd);
      if (iVar1 != 0) {
        pSVar2->ovrfl = '\x01';
        pSVar2->approx = '\x01';
      }
    }
    else if (iVar1 == 1) {
      pSVar2 = (SumCtx *)sqlite3_value_int64((sqlite3_value *)0x2259ed);
      if (pSVar2 == (SumCtx *)0x8000000000000000) {
        kahanBabuskaNeumaierStepInt64((SumCtx *)0x8000000000000000,in_stack_ffffffffffffffc8);
        kahanBabuskaNeumaierStepInt64(pSVar2,in_stack_ffffffffffffffc8);
      }
      else {
        kahanBabuskaNeumaierStepInt64(pSVar2,in_stack_ffffffffffffffc8);
      }
    }
    else {
      dVar3 = sqlite3_value_double((sqlite3_value *)0x225a54);
      kahanBabuskaNeumaierStep(pSVar2,-dVar3);
    }
  }
  return;
}

Assistant:

static void sumInverse(sqlite3_context *context, int argc, sqlite3_value**argv){
  SumCtx *p;
  int type;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  p = sqlite3_aggregate_context(context, sizeof(*p));
  type = sqlite3_value_numeric_type(argv[0]);
  /* p is always non-NULL because sumStep() will have been called first
  ** to initialize it */
  if( ALWAYS(p) && type!=SQLITE_NULL ){
    assert( p->cnt>0 );
    p->cnt--;
    if( !p->approx ){
      if( sqlite3SubInt64(&p->iSum, sqlite3_value_int64(argv[0])) ){
        p->ovrfl = 1;
        p->approx = 1;
      }
    }else if( type==SQLITE_INTEGER ){
      i64 iVal = sqlite3_value_int64(argv[0]);
      if( iVal!=SMALLEST_INT64 ){
        kahanBabuskaNeumaierStepInt64(p, -iVal);
      }else{
        kahanBabuskaNeumaierStepInt64(p, LARGEST_INT64);
        kahanBabuskaNeumaierStepInt64(p, 1);
      }
    }else{
      kahanBabuskaNeumaierStep(p, -sqlite3_value_double(argv[0]));
    }
  }
}